

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientService.cpp
# Opt level: O0

void __thiscall ClientService::setServerIP(ClientService *this,string *ip)

{
  int port;
  ClientSocketUDP *this_00;
  string local_38 [32];
  string *local_18;
  string *ip_local;
  ClientService *this_local;
  
  local_18 = ip;
  ip_local = &this->serverIp;
  std::__cxx11::string::operator=((string *)this,(string *)ip);
  this_00 = (ClientSocketUDP *)operator_new(0x28);
  port = this->serverPort;
  std::__cxx11::string::string(local_38,(string *)this);
  ClientSocketUDP::ClientSocketUDP(this_00,2,2,0,port,(string *)local_38);
  this->clientSocketUDP = this_00;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ClientService::setServerIP(string ip) {
    this->serverIp = ip;
    clientSocketUDP = new ClientSocketUDP(AF_INET, SOCK_DGRAM, 0, serverPort, serverIp);
}